

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
     Operation<duckdb::timestamp_t,long,duckdb::ArgMinMaxState<duckdb::timestamp_t,long>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (ArgMinMaxState<duckdb::timestamp_t,_long> *state,timestamp_t *x,long *y,
               AggregateBinaryInput *binary)

{
  if ((state->super_ArgMinMaxStateBase).is_initialized != false) {
    Execute<duckdb::timestamp_t,long,duckdb::ArgMinMaxState<duckdb::timestamp_t,long>>
              (state,(timestamp_t)x->value,*y,binary);
    return;
  }
  TemplatedValidityMask<unsigned_long>::RowIsValid
            (&binary->left_mask->super_TemplatedValidityMask<unsigned_long>,binary->lidx);
  (state->arg).value = x->value;
  state->value = *y;
  (state->super_ArgMinMaxStateBase).is_initialized = true;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}